

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::CompilerGLSL::
statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
          (CompilerGLSL *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,
          char (*ts_1) [4],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2,
          char (*ts_3) [2])

{
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_00;
  bool bVar1;
  char (*in_R9) [2];
  uint local_54;
  undefined1 local_50 [4];
  uint32_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  char (*ts_local_3) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_local_2;
  char (*ts_local_1) [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_local;
  CompilerGLSL *this_local;
  
  local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_3;
  ts_local_3 = (char (*) [2])ts_2;
  ts_local_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_1;
  ts_local_1 = (char (*) [4])ts;
  ts_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  bVar1 = Compiler::is_forcing_recompilation(&this->super_Compiler);
  if (bVar1) {
    this->statement_count = this->statement_count + 1;
  }
  else if (this->redirect_statement ==
           (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            *)0x0) {
    for (local_54 = 0; local_54 < this->indent; local_54 = local_54 + 1) {
      StringStream<4096UL,_4096UL>::operator<<(&this->buffer,"    ");
    }
    statement_inner<std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_local_1,
               (char (*) [4])ts_local_2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_local_3,
               (char (*) [2])local_30);
    StringStream<4096UL,_4096UL>::operator<<(&this->buffer,'\n');
  }
  else {
    this_00 = this->redirect_statement;
    join<std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
              ((string *)local_50,(diligent_spirv_cross *)ts_local_1,ts_local_2,
               (char (*) [4])ts_local_3,local_30,in_R9);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_50);
    ::std::__cxx11::string::~string((string *)local_50);
    this->statement_count = this->statement_count + 1;
  }
  return;
}

Assistant:

inline void statement(Ts &&... ts)
	{
		if (is_forcing_recompilation())
		{
			// Do not bother emitting code while force_recompile is active.
			// We will compile again.
			statement_count++;
			return;
		}

		if (redirect_statement)
		{
			redirect_statement->push_back(join(std::forward<Ts>(ts)...));
			statement_count++;
		}
		else
		{
			for (uint32_t i = 0; i < indent; i++)
				buffer << "    ";
			statement_inner(std::forward<Ts>(ts)...);
			buffer << '\n';
		}
	}